

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void libcellml::updateUnitsMap(UnitsPtr *units,UnitsMap *unitsMap,double exp)

{
  Units *this;
  EntityImpl *pEVar1;
  bool bVar2;
  iterator iVar3;
  ulong index;
  string unitsName;
  ModelPtr model;
  double uExp;
  UnitsPtr importedUnits;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  UnitsPtr refUnits;
  ImportSourcePtr importSource;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  double exp_local;
  double expMult;
  
  exp_local = exp;
  bVar2 = Units::isBaseUnit((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr);
  if (bVar2) {
    NamedEntity::name_abi_cxx11_
              (&unitsName,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            ::find(&unitsMap->_M_t,&unitsName);
    if ((_Rb_tree_header *)iVar3._M_node == &(unitsMap->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::_M_emplace_unique<std::__cxx11::string&,double&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)unitsMap,&unitsName,&exp_local);
    }
    else {
      *(double *)(iVar3._M_node + 2) = exp + *(double *)(iVar3._M_node + 2);
    }
  }
  else {
    bVar2 = isStandardUnit(units);
    if (!bVar2) {
      bVar2 = ImportedEntity::isImport
                        (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->super_ImportedEntity);
      if (bVar2) {
        ImportedEntity::importSource((ImportedEntity *)&importSource);
        ImportSource::model((ImportSource *)&model);
        ImportedEntity::importReference_abi_cxx11_
                  (&unitsName,
                   &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_ImportedEntity);
        Model::units((Model *)&importedUnits,
                     (string *)
                     model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::~string((string *)&unitsName);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        updateUnitsMap(&importedUnits,unitsMap,1.0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&importSource.
                    super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return;
      }
      for (index = 0;
          this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
          pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
          index < (ulong)((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                                pEVar1[2].mId.field_2._M_allocated_capacity) / 0x70);
          index = index + 1) {
        unitsName._M_dataplus._M_p = (pointer)&unitsName.field_2;
        unitsName._M_string_length = 0;
        importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&local_50;
        importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        unitsName.field_2._M_local_buf[0] = '\0';
        local_50._M_local_buf[0] = '\0';
        importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_80;
        importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_80._M_local_buf[0] = '\0';
        Units::unitAttributes
                  (this,index,&unitsName,(string *)&importSource,&uExp,&expMult,
                   (string *)&importedUnits);
        bVar2 = isStandardUnitName(&unitsName);
        if (bVar2) {
          updateUnitsMapWithStandardUnit(&unitsName,unitsMap,uExp * exp);
        }
        else {
          std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libcellml::Units,void>
                    ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                     &refUnits,
                     &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
          owningModel((ParentedEntityConstPtr *)&model);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Model::units((Model *)&refUnits,
                       (string *)
                       model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
          updateUnitsMap(&refUnits,unitsMap,uExp * exp);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__cxx11::string::~string((string *)&importedUnits);
        std::__cxx11::string::~string((string *)&importSource);
        std::__cxx11::string::~string((string *)&unitsName);
      }
      return;
    }
    NamedEntity::name_abi_cxx11_
              (&unitsName,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    updateUnitsMapWithStandardUnit(&unitsName,unitsMap,exp);
  }
  std::__cxx11::string::~string((string *)&unitsName);
  return;
}

Assistant:

void updateUnitsMap(const UnitsPtr &units, UnitsMap &unitsMap, double exp = 1.0)
{
    if (units->isBaseUnit()) {
        auto unitsName = units->name();
        auto found = unitsMap.find(unitsName);
        if (found == unitsMap.end()) {
            unitsMap.emplace(unitsName, exp);
        } else {
            found->second += exp;
        }
    } else if (isStandardUnit(units)) {
        updateUnitsMapWithStandardUnit(units->name(), unitsMap, exp);
    } else if (units->isImport()) {
        auto importSource = units->importSource();
        auto importedUnits = importSource->model()->units(units->importReference());
        updateUnitsMap(importedUnits, unitsMap);
    } else {
        for (size_t i = 0; i < units->unitCount(); ++i) {
            std::string ref;
            std::string pre;
            std::string id;
            double expMult;
            double uExp;
            units->unitAttributes(i, ref, pre, uExp, expMult, id);
            if (isStandardUnitName(ref)) {
                updateUnitsMapWithStandardUnit(ref, unitsMap, uExp * exp);
            } else {
                auto model = owningModel(units);
                auto refUnits = model->units(ref);
                updateUnitsMap(refUnits, unitsMap, uExp * exp);
            }
        }
    }
}